

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O2

void __thiscall hgdb::json::Scope<hgdb::json::Module>::~Scope(Scope<hgdb::json::Module> *this)

{
  ~Scope(this);
  operator_delete(this,0x80);
  return;
}

Assistant:

Scope() = default;